

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_semacheck2.c
# Opt level: O0

void visit_label_stmt(gvisitor_t *self,gnode_label_stmt_t *node)

{
  short sVar1;
  gtoken_t gVar2;
  gtoken_t type;
  gnode_label_stmt_t *node_local;
  gvisitor_t *self_local;
  
  gVar2 = (node->base).token.type;
  if (*(long *)((long)self->data + 8) == 0) {
    sVar1 = 0;
  }
  else {
    sVar1 = *(short *)(*(long *)((long)self->data + 0x18) +
                      (*(long *)((long)self->data + 8) + -1) * 2);
  }
  if (sVar1 != 0xf) {
    if (gVar2 == TOK_KEY_DEFAULT) {
      report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,
                   "\'default\' statement not in switch statement.");
    }
    if (gVar2 == TOK_KEY_CASE) {
      report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,
                   "\'case\' statement not in switch statement.");
    }
  }
  if (gVar2 == TOK_KEY_DEFAULT) {
    gvisit(self,node->stmt);
  }
  else if (gVar2 == TOK_KEY_CASE) {
    gvisit(self,node->expr);
    gvisit(self,node->stmt);
  }
  return;
}

Assistant:

static void visit_label_stmt (gvisitor_t *self, gnode_label_stmt_t *node) {
    DEBUG_SEMA2("visit_label_stmt");

    gtoken_t type = NODE_TOKEN_TYPE(node);
    if (!TOP_STATEMENT_ISA_SWITCH()) {
        if (type == TOK_KEY_DEFAULT) REPORT_ERROR(node, "'default' statement not in switch statement.");
        if (type == TOK_KEY_CASE) REPORT_ERROR(node, "'case' statement not in switch statement.");
    }

    if (type == TOK_KEY_DEFAULT) {visit(node->stmt);}
    else if (type == TOK_KEY_CASE) {visit(node->expr); visit(node->stmt);}
}